

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

MessageProcessingResult __thiscall helics::FederateState::processDelayQueue(FederateState *this)

{
  bool bVar1;
  long in_RDI;
  value_type *cmd;
  deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *tempQueue;
  pair<const_helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
  *dqueue;
  iterator __end2;
  iterator __begin2;
  map<helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_std::less<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
  *__range2;
  MessageProcessingResult ret_code;
  ActionMessage *in_stack_00000278;
  FederateState *in_stack_00000280;
  map<helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_std::less<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
  *in_stack_ffffffffffffffa8;
  undefined5 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb5;
  MessageProcessingResult in_stack_ffffffffffffffb6;
  byte bVar2;
  reference in_stack_ffffffffffffffc0;
  _Self local_28;
  _Self local_20;
  long local_18;
  MessageProcessingResult local_9;
  
  std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::clear
            ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)0x58eb8f
            );
  local_9 = CONTINUE_PROCESSING;
  bVar1 = std::
          map<helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_std::less<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
          ::empty((map<helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_std::less<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
                   *)0x58eba5);
  if (!bVar1) {
    local_18 = in_RDI + 0x490;
    local_20._M_node =
         (_Base_ptr)
         std::
         map<helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_std::less<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
         ::begin(in_stack_ffffffffffffffa8);
    local_28._M_node =
         (_Base_ptr)
         std::
         map<helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_std::less<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
         ::end(in_stack_ffffffffffffffa8);
    while (bVar1 = std::operator==(&local_20,&local_28), ((bVar1 ^ 0xffU) & 1) != 0) {
      std::
      _Rb_tree_iterator<std::pair<const_helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>
      ::operator*((_Rb_tree_iterator<std::pair<const_helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>
                   *)0x58ebff);
      local_9 = CONTINUE_PROCESSING;
      while( true ) {
        bVar2 = 0;
        if (local_9 == CONTINUE_PROCESSING) {
          bVar1 = CLI::std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::
                  empty((deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                        0x58ec2e);
          bVar2 = bVar1 ^ 0xff;
        }
        if ((bVar2 & 1) == 0) break;
        in_stack_ffffffffffffffc0 =
             CLI::std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::front
                       ((deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                        in_stack_ffffffffffffffc0);
        bVar1 = messageShouldBeDelayed((FederateState *)dqueue,(ActionMessage *)tempQueue);
        if (bVar1) {
          local_9 = DELAY_MESSAGE;
        }
        else {
          in_stack_ffffffffffffffb6 = processActionMessage(in_stack_00000280,in_stack_00000278);
          local_9 = in_stack_ffffffffffffffb6;
          if (in_stack_ffffffffffffffb6 != DELAY_MESSAGE) {
            CLI::std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::
            pop_front((deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                      CONCAT17(bVar2,CONCAT16(in_stack_ffffffffffffffb6,
                                              CONCAT15(in_stack_ffffffffffffffb5,
                                                       in_stack_ffffffffffffffb0))));
          }
        }
      }
      in_stack_ffffffffffffffb5 = returnableResult(local_9);
      if ((bool)in_stack_ffffffffffffffb5) {
        return local_9;
      }
      std::
      _Rb_tree_iterator<std::pair<const_helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>
                    *)CONCAT17(bVar2,CONCAT16(in_stack_ffffffffffffffb6,
                                              CONCAT15(in_stack_ffffffffffffffb5,
                                                       in_stack_ffffffffffffffb0))));
    }
  }
  return local_9;
}

Assistant:

MessageProcessingResult FederateState::processDelayQueue() noexcept
{
    delayedFederates.clear();
    auto ret_code = MessageProcessingResult::CONTINUE_PROCESSING;
    if (!delayQueues.empty()) {
        for (auto& dqueue : delayQueues) {
            auto& tempQueue = dqueue.second;
            ret_code = MessageProcessingResult::CONTINUE_PROCESSING;
            // we specifically want to stop the loop on a delay_message return
            while ((ret_code == MessageProcessingResult::CONTINUE_PROCESSING) &&
                   (!tempQueue.empty())) {
                auto& cmd = tempQueue.front();
                if (messageShouldBeDelayed(cmd)) {
                    ret_code = MessageProcessingResult::DELAY_MESSAGE;
                    continue;
                }

                ret_code = processActionMessage(cmd);
                if (ret_code == MessageProcessingResult::DELAY_MESSAGE) {
                    continue;
                }
                tempQueue.pop_front();
            }
            if (returnableResult(ret_code)) {
                break;
            }
        }
    }
    return ret_code;
}